

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

string * __thiscall storage::read_string_abi_cxx11_(string *__return_storage_ptr__,storage *this)

{
  ulong __n;
  uint in_EAX;
  size_t sVar1;
  undefined8 uStack_28;
  uint32_t size;
  
  uStack_28 = (ulong)in_EAX;
  sVar1 = fread((void *)((long)&uStack_28 + 4),1,4,(FILE *)this->m_file);
  if (sVar1 != 4) {
    __assert_fail("std::fread(&size, 1, sizeof(size), m_file) == sizeof(size)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/niXman[P]blockchain/storage.hpp"
                  ,0xdc,"std::string storage::read_string()");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __n = uStack_28 >> 0x20;
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  sVar1 = fread((__return_storage_ptr__->_M_dataplus)._M_p,1,__n,(FILE *)this->m_file);
  if (sVar1 == __n) {
    return __return_storage_ptr__;
  }
  __assert_fail("std::fread(const_cast<char *>(s.data()), 1, size, m_file) == size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/niXman[P]blockchain/storage.hpp"
                ,0xdf,"std::string storage::read_string()");
}

Assistant:

std::string read_string() {
        std::uint32_t size{};
        assert(std::fread(&size, 1, sizeof(size), m_file) == sizeof(size));
        std::string s;
        s.resize(size);
        assert(std::fread(const_cast<char *>(s.data()), 1, size, m_file) == size);

        return s;
    }